

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void __thiscall ot::commissioner::JsonException::JsonException(JsonException *this,Error *aError)

{
  pointer pcVar1;
  
  std::invalid_argument::invalid_argument(&this->super_invalid_argument,(string *)&aError->mMessage)
  ;
  *(undefined ***)this = &PTR__JsonException_002e6438;
  (this->mError).mCode = aError->mCode;
  (this->mError).mMessage._M_dataplus._M_p = (pointer)&(this->mError).mMessage.field_2;
  pcVar1 = (aError->mMessage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->mError).mMessage,pcVar1,pcVar1 + (aError->mMessage)._M_string_length)
  ;
  return;
}

Assistant:

explicit JsonException(Error aError)
        : std::invalid_argument(aError.GetMessage())
        , mError(aError)
    {
    }